

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

bool chrono::geometry::InterpolateAndInsert
               (ChTriangleMeshConnected *mesh,int ibuffer,int i1,int i2,int *created_index)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar3;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lStack_40;
  ChVector<double> v;
  
  if (3 < (uint)ibuffer) {
    return false;
  }
  switch(ibuffer) {
  case 0:
    pCVar8 = (mesh->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar8 == (mesh->m_vertices).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    auVar16._0_8_ = pCVar8[i1].m_data[0] + pCVar8[i2].m_data[0];
    auVar16._8_8_ = pCVar8[i1].m_data[1] + pCVar8[i2].m_data[1];
    auVar11._12_4_ = 0x3fe00000;
    auVar11._0_12_ = ZEXT812(0x3fe0000000000000);
    v.m_data._0_16_ = vmulpd_avx512vl(auVar16,auVar11);
    v.m_data[2] = (pCVar8[i1].m_data[2] + pCVar8[i2].m_data[2]) * 0.5;
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (&mesh->m_vertices,&v);
    lVar13 = (long)(mesh->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(mesh->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 1:
    pCVar8 = (mesh->m_normals).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar8 == (mesh->m_normals).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    auVar18._0_8_ = pCVar8[i1].m_data[0] + pCVar8[i2].m_data[0];
    auVar18._8_8_ = pCVar8[i1].m_data[1] + pCVar8[i2].m_data[1];
    auVar10._12_4_ = 0x3fe00000;
    auVar10._0_12_ = ZEXT812(0x3fe0000000000000);
    v.m_data._0_16_ = vmulpd_avx512vl(auVar18,auVar10);
    v.m_data[2] = (pCVar8[i1].m_data[2] + pCVar8[i2].m_data[2]) * 0.5;
    ChVector<double>::Normalize(&v);
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (&mesh->m_normals,&v);
    lVar13 = (long)(mesh->m_normals).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(mesh->m_normals).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 2:
    pCVar6 = (mesh->m_UV).
             super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar6 == (mesh->m_UV).
                  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    auVar15._0_8_ = pCVar6[i1].m_data[0] + pCVar6[i2].m_data[0];
    auVar15._8_8_ = pCVar6[i1].m_data[1] + pCVar6[i2].m_data[1];
    auVar9._12_4_ = 0x3fe00000;
    auVar9._0_12_ = ZEXT812(0x3fe0000000000000);
    v.m_data._0_16_ = vmulpd_avx512vl(auVar15,auVar9);
    std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>::push_back
              (&mesh->m_UV,(value_type *)&v);
    iVar12 = (int)((ulong)((long)(mesh->m_UV).
                                 super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(mesh->m_UV).
                                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    goto LAB_00d5a8fa;
  case 3:
    pCVar7 = (mesh->m_colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pCVar7 == (mesh->m_colors).
                  super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return false;
    }
    uVar1 = pCVar7[i1].R;
    uVar4 = pCVar7[i1].G;
    uVar2 = pCVar7[i2].R;
    uVar5 = pCVar7[i2].G;
    auVar17._0_4_ = (float)uVar1 + (float)uVar2;
    auVar17._4_4_ = (float)uVar4 + (float)uVar5;
    auVar17._8_8_ = 0;
    auVar14._8_4_ = 0x3f000000;
    auVar14._0_8_ = 0x3f0000003f000000;
    auVar14._12_4_ = 0x3f000000;
    auVar14 = vmulps_avx512vl(auVar17,auVar14);
    dVar3 = (double)vmovlps_avx(auVar14);
    v.m_data[1]._4_4_ = (undefined4)((ulong)v.m_data[0] >> 0x20);
    v.m_data[1]._0_4_ = (pCVar7[i1].B + pCVar7[i2].B) * 0.5;
    v.m_data[0] = dVar3;
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::push_back
              (&mesh->m_colors,(value_type *)&v);
    lVar13 = (long)(mesh->m_colors).
                   super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mesh->m_colors).
                   super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                   super__Vector_impl_data._M_start;
    lStack_40 = 0xc;
    goto LAB_00d5a8f4;
  }
  lStack_40 = 0x18;
LAB_00d5a8f4:
  iVar12 = (int)(lVar13 / lStack_40);
LAB_00d5a8fa:
  *created_index = iVar12 + -1;
  return true;
}

Assistant:

bool InterpolateAndInsert(ChTriangleMeshConnected& mesh, int ibuffer, int i1, int i2, int& created_index) {
    switch (ibuffer) {
        case 0: {
            if (mesh.m_vertices.empty())
                return false;
            ChVector<> Vnew = (mesh.m_vertices[i1] + mesh.m_vertices[i2]) * 0.5;
            mesh.m_vertices.push_back(Vnew);
            created_index = (int)mesh.m_vertices.size() - 1;
            return true;
        }
        case 1: {
            if (mesh.m_normals.empty())
                return false;
            ChVector<> Vnew = (mesh.m_normals[i1] + mesh.m_normals[i2]) * 0.5;
            Vnew.Normalize();
            mesh.m_normals.push_back(Vnew);
            created_index = (int)mesh.m_normals.size() - 1;
            return true;
        }
        case 2: {
            if (mesh.m_UV.empty())
                return false;
            ChVector2<> Vnew = (mesh.m_UV[i1] + mesh.m_UV[i2]) * 0.5;
            mesh.m_UV.push_back(Vnew);
            created_index = (int)mesh.m_UV.size() - 1;
            return true;
        }
        case 3: {
            if (mesh.m_colors.empty())
                return false;
            ChColor Vnew = {(mesh.m_colors[i1].R + mesh.m_colors[i2].R) * 0.5f,
                            (mesh.m_colors[i1].G + mesh.m_colors[i2].G) * 0.5f,
                            (mesh.m_colors[i1].B + mesh.m_colors[i2].B) * 0.5f};
            mesh.m_colors.push_back(Vnew);
            created_index = (int)mesh.m_colors.size() - 1;
            return true;
        }
        default:
            return false;
    }
}